

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

longlong __thiscall mkvparser::Chapters::Atom::GetStopTime(Atom *this,Chapters *pChapters)

{
  SegmentInfo *pSVar1;
  long lVar2;
  longlong lVar3;
  
  lVar3 = -1;
  if (((pChapters != (Chapters *)0x0) && (pChapters->m_pSegment != (Segment *)0x0)) &&
     (pSVar1 = pChapters->m_pSegment->m_pInfo, pSVar1 != (SegmentInfo *)0x0)) {
    lVar2 = pSVar1->m_timecodeScale;
    lVar3 = lVar2 * this->m_stop_timecode;
    if (lVar2 < 1) {
      lVar3 = -1;
    }
    if (this->m_stop_timecode < 0) {
      lVar3 = -1;
    }
  }
  return lVar3;
}

Assistant:

long long Chapters::Atom::GetStopTime(const Chapters* pChapters) const {
  return GetTime(pChapters, m_stop_timecode);
}